

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::numtostr::x_write<double>(double x,numtostr *this)

{
  byte bVar1;
  uint uVar2;
  lconv *plVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  char cVar7;
  bool bVar8;
  char thousands_sep;
  char local_19;
  
  if ((x != 0.0) || (NAN(x))) {
    uVar2 = snprintf((char *)this,0x40,"%.*g",0xf);
    if ((int)uVar2 < 1) {
      __assert_fail("written_bytes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x208a,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    if (0x3f < uVar2) {
      __assert_fail("static_cast<size_t>(written_bytes) < m_buf.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x208c,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    plVar3 = localeconv();
    if (plVar3 == (lconv *)0x0) {
      __assert_fail("loc != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                    ,0x2090,
                    "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                   );
    }
    cVar7 = '\0';
    if (plVar3->thousands_sep == (char *)0x0) {
      local_19 = '\0';
    }
    else {
      local_19 = *plVar3->thousands_sep;
    }
    if (plVar3->decimal_point != (char *)0x0) {
      cVar7 = *plVar3->decimal_point;
    }
    if (local_19 != '\0') {
      pcVar4 = std::__remove_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                         ((char *)this,(this->m_buf)._M_elems + uVar2,
                          (_Iter_equals_val<const_char>)&local_19);
      __n = (long)this + (0x40 - (long)pcVar4);
      if (__n != 0) {
        memset(pcVar4,0,__n);
      }
    }
    if ((cVar7 != '\0') && (cVar7 != '.')) {
      lVar5 = 0;
      do {
        if (cVar7 == (this->m_buf)._M_elems[lVar5]) {
          (this->m_buf)._M_elems[lVar5] = '.';
          break;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x40);
    }
    bVar8 = true;
    uVar6 = 0;
    bVar1 = (this->m_buf)._M_elems[0];
    while (bVar1 != 0) {
      if ((bVar8) &&
         ((0x37 < bVar1 - 0x2e || ((0x80000000800001U >> ((ulong)(bVar1 - 0x2e) & 0x3f) & 1) == 0)))
         ) {
        bVar8 = true;
        if (uVar6 == 0x3f) goto LAB_0011873e;
      }
      else {
        if (uVar6 == 0x3f) {
          return;
        }
        bVar8 = false;
      }
      uVar6 = uVar6 + 1;
      bVar1 = (this->m_buf)._M_elems[uVar6];
    }
    if (bVar8) {
      if (0x3d < uVar6) {
LAB_0011873e:
        __assert_fail("(i + 2) < m_buf.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20be,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      if ((this->m_buf)._M_elems[uVar6] != '\0') {
        __assert_fail("m_buf[i] == \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c0,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      if ((this->m_buf)._M_elems[uVar6 - 1] == '\0') {
        __assert_fail("m_buf[i - 1] != \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c1,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
      pcVar4 = (this->m_buf)._M_elems + uVar6;
      pcVar4[0] = '.';
      pcVar4[1] = '0';
      if ((this->m_buf)._M_elems[uVar6 + 2] != '\0') {
        __assert_fail("m_buf[i + 2] == \'\\0\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                      ,0x20c8,
                      "void nlohmann::basic_json<>::numtostr::x_write(NumberType, std::false_type) [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer, NumberType = double]"
                     );
      }
    }
  }
  else {
    bVar8 = (long)x < 0;
    if (bVar8) {
      (this->m_buf)._M_elems[0] = '-';
    }
    pcVar4 = (this->m_buf)._M_elems + bVar8;
    pcVar4[0] = '0';
    pcVar4[1] = '.';
    (this->m_buf)._M_elems[(ulong)bVar8 + 2] = '0';
  }
  return;
}

Assistant:

void x_write(NumberType x, /*is_integral=*/std::false_type)
        {
            // special case for 0.0 and -0.0
            if (x == 0)
            {
                size_t i = 0;
                if (std::signbit(x))
                {
                    m_buf[i++] = '-';
                }
                m_buf[i++] = '0';
                m_buf[i++] = '.';
                m_buf[i] = '0';
                return;
            }

            // get number of digits for a text -> float -> text round-trip
            static constexpr auto d = std::numeric_limits<NumberType>::digits10;

            // the actual conversion
            const auto written_bytes = snprintf(m_buf.data(), m_buf.size(), "%.*g", d, x);

            // negative value indicates an error
            assert(written_bytes > 0);
            // check if buffer was large enough
            assert(static_cast<size_t>(written_bytes) < m_buf.size());

            // read information from locale
            const auto loc = localeconv();
            assert(loc != nullptr);
            const char thousands_sep = !loc->thousands_sep ? '\0'
                                       : loc->thousands_sep[0];

            const char decimal_point = !loc->decimal_point ? '\0'
                                       : loc->decimal_point[0];

            // erase thousands separator
            if (thousands_sep != '\0')
            {
                const auto end = std::remove(m_buf.begin(), m_buf.begin() + written_bytes, thousands_sep);
                std::fill(end, m_buf.end(), '\0');
            }

            // convert decimal point to '.'
            if (decimal_point != '\0' and decimal_point != '.')
            {
                for (auto& c : m_buf)
                {
                    if (c == decimal_point)
                    {
                        c = '.';
                        break;
                    }
                }
            }

            // determine if need to append ".0"
            size_t i = 0;
            bool value_is_int_like = true;
            for (i = 0; i < m_buf.size(); ++i)
            {
                // break when end of number is reached
                if (m_buf[i] == '\0')
                {
                    break;
                }

                // check if we find non-int character
                value_is_int_like = value_is_int_like and m_buf[i] != '.' and
                                    m_buf[i] != 'e' and m_buf[i] != 'E';
            }

            if (value_is_int_like)
            {
                // there must be 2 bytes left for ".0"
                assert((i + 2) < m_buf.size());
                // we write to the end of the number
                assert(m_buf[i] == '\0');
                assert(m_buf[i - 1] != '\0');

                // add ".0"
                m_buf[i] = '.';
                m_buf[i + 1] = '0';

                // the resulting string is properly terminated
                assert(m_buf[i + 2] == '\0');
            }
        }